

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm7tdmi.c
# Opt level: O3

void fill_pipe(arm7tdmi_t *state)

{
  uint uVar1;
  uint uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  char *__format;
  ulong uVar6;
  
  if (((uint)state->cpsr & 0x20) == 0) {
    uVar4 = (*state->read_word)(state->pc,ACCESS_NONSEQUENTIAL);
    state->pipeline[0] = uVar4;
    uVar4 = state->pc + 4;
    state->pc = uVar4;
    uVar4 = (*state->read_word)(uVar4,ACCESS_SEQUENTIAL);
    state->pipeline[1] = uVar4;
    if (gba_log_verbosity < 3) {
      return;
    }
    uVar1 = state->pc;
    uVar2 = state->pipeline[0];
    uVar5 = uVar1 - 4;
    __format = "[DEBUG] [ARM] Filling the instruction pipeline: 0x%08X = 0x%08X / 0x%08X = 0x%08X\n"
    ;
    uVar6 = (ulong)uVar4;
  }
  else {
    uVar3 = (*state->read_half)(state->pc,ACCESS_NONSEQUENTIAL);
    state->pipeline[0] = (uint)uVar3;
    uVar4 = state->pc + 2;
    state->pc = uVar4;
    uVar3 = (*state->read_half)(uVar4,ACCESS_SEQUENTIAL);
    uVar6 = (ulong)uVar3;
    state->pipeline[1] = (uint)uVar3;
    if (gba_log_verbosity < 3) {
      return;
    }
    uVar1 = state->pc;
    uVar2 = state->pipeline[0];
    uVar5 = uVar1 - 2;
    __format = "[DEBUG] [THM] Filling the instruction pipeline: 0x%08X = 0x%04X / 0x%08X = 0x%04X\n"
    ;
  }
  printf(__format,(ulong)uVar5,(ulong)uVar2,(ulong)uVar1,uVar6);
  return;
}

Assistant:

void fill_pipe(arm7tdmi_t* state) {
    if (state->cpsr.thumb) {
        state->pipeline[0] = state->read_half(state->pc, ACCESS_NONSEQUENTIAL);
        state->pc += 2;
        state->pipeline[1] = state->read_half(state->pc, ACCESS_SEQUENTIAL);

        logdebug("[THM] Filling the instruction pipeline: 0x%08X = 0x%04X / 0x%08X = 0x%04X",
                 state->pc - 2,
                 state->pipeline[0],
                 state->pc,
                 state->pipeline[1])
    } else {
        state->pipeline[0] = state->read_word(state->pc, ACCESS_NONSEQUENTIAL);
        state->pc += 4;
        state->pipeline[1] = state->read_word(state->pc, ACCESS_SEQUENTIAL);

        logdebug("[ARM] Filling the instruction pipeline: 0x%08X = 0x%08X / 0x%08X = 0x%08X",
                 state->pc - 4,
                 state->pipeline[0],
                 state->pc,
                 state->pipeline[1])
    }
}